

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O2

complex<double> zdotc(int n,complex<double> *cx,int incx,complex<double> *cy,int incy)

{
  undefined8 in_RAX;
  uint uVar1;
  undefined4 in_register_00000014;
  complex<double> *__y;
  long lVar2;
  double *pdVar3;
  bool bVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar5;
  complex<double> cVar6;
  complex<double> cVar7;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  cVar7._M_value._8_8_ = CONCAT44(in_register_00000014,incx);
  if (0 < n) {
    cVar6._M_value._4_4_ = 0;
    cVar6._M_value._0_4_ = incx ^ 1U;
    cVar6._M_value._8_8_ = cVar7._M_value._8_8_;
    if (incy == 1 && (incx ^ 1U) == 0) {
      local_40 = 0.0;
      local_38 = 0.0;
      for (lVar2 = 0; (ulong)(uint)n << 4 != lVar2; lVar2 = lVar2 + 0x10) {
        local_50 = *(double *)(cx->_M_value + lVar2);
        dVar5 = -*(double *)(cx->_M_value + lVar2 + 8);
        local_48 = dVar5;
        cVar6 = std::operator*((complex<double> *)&local_50,
                               (complex<double> *)(cy->_M_value + lVar2));
        local_40 = local_40 + extraout_XMM0_Qa;
        local_38 = local_38 + dVar5;
      }
    }
    else {
      uVar1 = incx >> 0x1f & (1 - n) * incx;
      lVar2 = (long)(incy >> 0x1f & (1 - n) * incy);
      pdVar3 = (double *)(cx[(int)uVar1]._M_value + 8);
      cVar6._M_value._8_4_ = uVar1;
      cVar6._M_value._0_8_ = lVar2 * 0x10;
      cVar6._M_value._12_4_ = 0;
      __y = cy + lVar2;
      local_40 = 0.0;
      local_38 = 0.0;
      while (bVar4 = n != 0, n = n + -1, bVar4) {
        local_50 = pdVar3[-1];
        dVar5 = -*pdVar3;
        local_48 = dVar5;
        cVar6 = std::operator*((complex<double> *)&local_50,__y);
        local_40 = local_40 + extraout_XMM0_Qa_00;
        local_38 = local_38 + dVar5;
        pdVar3 = pdVar3 + (long)incx * 2;
        __y = __y + incy;
      }
    }
    return (complex<double>)cVar6._M_value;
  }
  cVar7._M_value._0_8_ = in_RAX;
  return (complex<double>)cVar7._M_value;
}

Assistant:

complex <double> zdotc ( int n, complex <double> cx[], int incx,
  complex <double> cy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    ZDOTC forms the conjugated dot product of two complex <double> vectors.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input, complex <double> CX[], the first vector.
//
//    Input, int INCX, the increment between successive entries in CX.
//
//    Input, complex <double> CY[], the second vector.
//
//    Input, int INCY, the increment between successive entries in CY.
//
//    Output, complex <double> ZDOTC, the conjugated dot product of
//    the corresponding entries of CX and CY.
//
{
  int i;
  int ix;
  int iy;
  complex <double> value;

  value = complex <double> ( 0.0, 0.0 );

  if ( n <= 0 )
  {
    return value;
  }

  if ( incx == 1 && incy == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      value = value + conj ( cx[i] ) * cy[i];
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      value = value + conj ( cx[ix] ) * cy[iy];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  return value;
}